

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

void __thiscall duckdb::StringValueScanner::Initialize(StringValueScanner *this)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  idx_t iVar1;
  CSVStateMachine *pCVar2;
  CSVBufferHandle *pCVar3;
  idx_t iVar4;
  idx_t iVar5;
  
  *(undefined2 *)(this->super_BaseScanner).states.states = 0xb0b;
  if ((this->result).super_ScannerResult.result_size == 1) {
LAB_00d04db0:
    iVar4 = (this->super_BaseScanner).iterator.pos.buffer_idx;
    iVar5 = (this->super_BaseScanner).iterator.pos.buffer_pos;
    this->start_pos = (this->super_BaseScanner).iterator.buffer_size * iVar4 + iVar5;
  }
  else {
    if ((this->super_BaseScanner).sniffing == true) {
      this_00 = &(this->super_BaseScanner).state_machine;
      pCVar2 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      if (pCVar2->options->null_padding == true) {
        pCVar2 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        if ((pCVar2->options->dialect_options).skip_rows.set_by_user != true) goto LAB_00d04db0;
      }
    }
    SetStart(this);
    iVar4 = (this->super_BaseScanner).iterator.pos.buffer_idx;
    iVar5 = (this->super_BaseScanner).iterator.pos.buffer_pos;
  }
  pCVar3 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                     (&(this->super_BaseScanner).cur_buffer_handle);
  iVar1 = pCVar3->actual_size;
  (this->result).super_ScannerResult.last_position.buffer_pos = iVar5;
  (this->result).super_ScannerResult.last_position.buffer_size = iVar1;
  (this->result).super_ScannerResult.last_position.buffer_idx = iVar4;
  (this->result).current_line_position.begin.buffer_idx = iVar4;
  iVar5 = (this->result).super_ScannerResult.last_position.buffer_pos;
  iVar1 = (this->result).super_ScannerResult.last_position.buffer_size;
  (this->result).current_line_position.begin.buffer_pos = iVar5;
  (this->result).current_line_position.begin.buffer_size = iVar1;
  (this->result).current_line_position.end.buffer_idx = iVar4;
  (this->result).current_line_position.end.buffer_pos = iVar5;
  (this->result).current_line_position.end.buffer_size = iVar1;
  return;
}

Assistant:

void StringValueScanner::Initialize() {
	states.Initialize();

	if (result.result_size != 1 && !(sniffing && state_machine->options.null_padding &&
	                                 !state_machine->options.dialect_options.skip_rows.IsSetByUser())) {
		SetStart();
	} else {
		start_pos = iterator.GetGlobalCurrentPos();
	}

	result.last_position = {iterator.pos.buffer_idx, iterator.pos.buffer_pos, cur_buffer_handle->actual_size};
	result.current_line_position.begin = result.last_position;
	result.current_line_position.end = result.current_line_position.begin;
}